

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 *pIVar3;
  int *piVar4;
  long lVar5;
  ImS8 *pIVar6;
  ImU16 *pIVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  char cVar11;
  ImU16 IVar12;
  uint uVar13;
  ImGuiNavLayer IVar14;
  ImGuiContextHook *pIVar15;
  char *pcVar16;
  uint *puVar17;
  ImGuiViewportP *pIVar18;
  ImGuiInputEvent *pIVar19;
  ImGuiTableTempData *pIVar20;
  ImGuiWindowStackData *pIVar21;
  ImGuiPopupData *pIVar22;
  ImGuiGroupData *pIVar23;
  ImGuiStackLevelInfo *pIVar24;
  undefined1 auVar25 [12];
  undefined8 uVar26;
  ImGuiContext *pIVar27;
  undefined3 uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint uVar33;
  ImGuiID IVar34;
  ImGuiInputSource IVar35;
  ImGuiNavLayer layer;
  ImGuiContext *ctx;
  ulong uVar36;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiWindow *pIVar37;
  ImGuiContext *pIVar38;
  ImGuiWindowStackData *__dest_01;
  ImGuiPopupData *__dest_02;
  int *piVar39;
  int *piVar40;
  ImGuiGroupData *__dest_03;
  ImGuiStackLevelInfo *__dest_04;
  int i;
  ImGuiID IVar41;
  ImGuiDir IVar42;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *pIVar43;
  ImGuiWindow *window;
  int iVar44;
  ImGuiNavMoveFlags move_flags;
  ImGuiContext *g;
  int iVar45;
  float *pfVar46;
  ImFont *font;
  float *pfVar47;
  bool *pbVar48;
  ImGuiDir IVar49;
  ImGuiWindow *child_window;
  ImRect *pIVar50;
  ImGuiWindow *old_nav_window;
  ImGuiContext *g_1;
  long lVar51;
  long lVar52;
  ImGuiContext *pIVar53;
  ImGuiContext *g_2;
  ulong uVar54;
  ImGuiContext *pIVar55;
  bool bVar56;
  byte bVar57;
  uint uVar58;
  float fVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar62;
  ImVec2 IVar63;
  ImVec2 IVar64;
  ImVec4 IVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ImVec2 IVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar84;
  float fVar71;
  float fVar72;
  ImVec2 IVar73;
  ImVec2 IVar74;
  ImVec2 IVar75;
  int iVar85;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ImVec2 IVar79;
  float fVar82;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  char local_88;
  ImRect local_48;
  undefined1 auVar76 [16];
  
  pIVar27 = GImGui;
  bVar57 = 0;
  uVar36 = (ulong)(GImGui->Hooks).Size;
  if (0 < (long)uVar36) {
    lVar51 = -uVar36;
    uVar54 = uVar36 + 1;
    lVar52 = uVar36 << 5;
    do {
      pIVar15 = (pIVar27->Hooks).Data;
      if (*(int *)(pIVar15 + lVar52 + -0x1c) == 7) {
        memmove(pIVar15 + lVar52 + -0x20,pIVar15 + lVar52,((int)uVar36 + lVar51) * 0x20);
        uVar33 = (pIVar27->Hooks).Size - 1;
        uVar36 = (ulong)uVar33;
        (pIVar27->Hooks).Size = uVar33;
      }
      lVar51 = lVar51 + 1;
      uVar54 = uVar54 - 1;
      lVar52 = lVar52 + -0x20;
    } while (1 < uVar54);
    if (0 < (int)uVar36) {
      lVar52 = 0;
      lVar51 = 0;
      do {
        pIVar15 = (pIVar27->Hooks).Data;
        if (*(int *)(pIVar15 + lVar52 + 4) == 0) {
          (**(code **)(pIVar15 + lVar52 + 0x10))(pIVar27,pIVar15 + lVar52);
          uVar36 = (ulong)(uint)(pIVar27->Hooks).Size;
        }
        lVar51 = lVar51 + 1;
        lVar52 = lVar52 + 0x20;
      } while (lVar51 < (int)uVar36);
    }
  }
  pIVar55 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar55->SettingsLoaded == false) {
    pcVar16 = (pIVar55->IO).IniFilename;
    if (pcVar16 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar16);
    }
    pIVar55->SettingsLoaded = true;
  }
  if ((0.0 < pIVar55->SettingsDirtyTimer) &&
     (fVar59 = pIVar55->SettingsDirtyTimer - (pIVar55->IO).DeltaTime,
     pIVar55->SettingsDirtyTimer = fVar59, fVar59 <= 0.0)) {
    pcVar16 = (pIVar55->IO).IniFilename;
    if (pcVar16 == (char *)0x0) {
      (pIVar55->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar16);
    }
    pIVar55->SettingsDirtyTimer = 0.0;
  }
  fVar59 = (pIVar27->IO).DeltaTime;
  pIVar27->Time = (double)fVar59 + pIVar27->Time;
  pIVar27->WithinFrameScope = true;
  pIVar27->FrameCount = pIVar27->FrameCount + 1;
  pIVar27->TooltipOverrideCount = 0;
  pIVar27->WindowsActiveCount = 0;
  if ((pIVar27->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar17 = (pIVar27->MenusIdSubmittedThisFrame).Data;
    if (puVar17 != (uint *)0x0) {
      memcpy(__dest,puVar17,(long)(pIVar27->MenusIdSubmittedThisFrame).Size << 2);
      puVar17 = (pIVar27->MenusIdSubmittedThisFrame).Data;
      if ((puVar17 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar17,GImAllocatorUserData);
    }
    (pIVar27->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar27->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar59 = (pIVar27->IO).DeltaTime;
  }
  pIVar55 = GImGui;
  (pIVar27->MenusIdSubmittedThisFrame).Size = 0;
  iVar45 = pIVar27->FramerateSecPerFrameIdx;
  pIVar27->FramerateSecPerFrameAccum =
       (fVar59 - pIVar27->FramerateSecPerFrame[iVar45]) + pIVar27->FramerateSecPerFrameAccum;
  pIVar27->FramerateSecPerFrame[iVar45] = fVar59;
  iVar44 = iVar45 + (int)((ulong)((long)(iVar45 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar27->FramerateSecPerFrameIdx = iVar45 + 1 + ((iVar44 >> 6) - (iVar44 >> 0x1f)) * -0x78;
  iVar45 = 0x77;
  if (pIVar27->FramerateSecPerFrameCount < 0x77) {
    iVar45 = pIVar27->FramerateSecPerFrameCount;
  }
  pIVar27->FramerateSecPerFrameCount = iVar45 + 1;
  uVar33 = -(uint)(0.0 < pIVar27->FramerateSecPerFrameAccum);
  (pIVar27->IO).Framerate =
       (float)(~uVar33 & 0x7f7fffff |
              (uint)(1.0 / (pIVar27->FramerateSecPerFrameAccum / (float)(iVar45 + 1))) & uVar33);
  pIVar18 = *(pIVar55->Viewports).Data;
  (pIVar18->super_ImGuiViewport).Flags = 5;
  (pIVar18->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar18->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar18->super_ImGuiViewport).Size = (pIVar55->IO).DisplaySize;
  if (0 < (pIVar55->Viewports).Size) {
    lVar52 = 0;
    do {
      pIVar18 = (pIVar55->Viewports).Data[lVar52];
      IVar60 = pIVar18->BuildWorkOffsetMin;
      pIVar18->WorkOffsetMin = IVar60;
      IVar73 = pIVar18->BuildWorkOffsetMax;
      pIVar18->WorkOffsetMax = IVar73;
      (pIVar18->BuildWorkOffsetMin).x = 0.0;
      (pIVar18->BuildWorkOffsetMin).y = 0.0;
      (pIVar18->BuildWorkOffsetMax).x = 0.0;
      (pIVar18->BuildWorkOffsetMax).y = 0.0;
      IVar62 = (pIVar18->super_ImGuiViewport).Size;
      fVar59 = IVar73.x + (IVar62.x - IVar60.x);
      fVar82 = IVar73.y + (IVar62.y - IVar60.y);
      IVar62 = (pIVar18->super_ImGuiViewport).Pos;
      IVar73.x = IVar62.x + IVar60.x;
      IVar73.y = IVar62.y + IVar60.y;
      IVar62.x = (float)(-(uint)(0.0 < fVar59) & (uint)fVar59);
      IVar62.y = (float)(-(uint)(0.0 < fVar82) & (uint)fVar82);
      (pIVar18->super_ImGuiViewport).WorkPos = IVar73;
      (pIVar18->super_ImGuiViewport).WorkSize = IVar62;
      lVar52 = lVar52 + 1;
    } while (lVar52 < (pIVar55->Viewports).Size);
  }
  ((pIVar27->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar52 = (long)(pIVar27->Viewports).Size;
  IVar65 = _DAT_0017b810;
  if (0 < lVar52) {
    lVar51 = 0;
    do {
      pIVar18 = (pIVar27->Viewports).Data[lVar51];
      fVar59 = (pIVar18->super_ImGuiViewport).Pos.x;
      if (fVar59 < IVar65.x) {
        IVar65.x = fVar59;
      }
      fVar82 = (pIVar18->super_ImGuiViewport).Pos.y;
      if (fVar82 < IVar65.y) {
        IVar65.y = fVar82;
      }
      fVar59 = fVar59 + (pIVar18->super_ImGuiViewport).Size.x;
      if (IVar65.z < fVar59) {
        IVar65.z = fVar59;
      }
      fVar82 = fVar82 + (pIVar18->super_ImGuiViewport).Size.y;
      if (IVar65.w < fVar82) {
        IVar65.w = fVar82;
      }
      lVar51 = lVar51 + 1;
    } while (lVar52 != lVar51);
  }
  (pIVar27->DrawListSharedData).ClipRectFullscreen = IVar65;
  fVar59 = (pIVar27->Style).CircleTessellationMaxError;
  (pIVar27->DrawListSharedData).CurveTessellationTol = (pIVar27->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar27->DrawListSharedData,fVar59);
  bVar56 = (pIVar27->Style).AntiAliasedLines;
  uVar33 = (uint)bVar56;
  (pIVar27->DrawListSharedData).InitialFlags = (uint)bVar56;
  if (((pIVar27->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar27->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar33 = bVar56 | 2;
    (pIVar27->DrawListSharedData).InitialFlags = uVar33;
  }
  if ((pIVar27->Style).AntiAliasedFill == true) {
    uVar33 = uVar33 | 4;
    (pIVar27->DrawListSharedData).InitialFlags = uVar33;
  }
  if (((pIVar27->IO).BackendFlags & 8) != 0) {
    (pIVar27->DrawListSharedData).InitialFlags = uVar33 | 8;
  }
  if (0 < (pIVar27->Viewports).Size) {
    lVar52 = 0;
    do {
      pIVar18 = (pIVar27->Viewports).Data[lVar52];
      (pIVar18->DrawDataP).DisplaySize.x = 0.0;
      (pIVar18->DrawDataP).DisplaySize.y = 0.0;
      (pIVar18->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar18->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar18->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar18->DrawDataP).DisplayPos.x = 0.0;
      (pIVar18->DrawDataP).DisplayPos.y = 0.0;
      (pIVar18->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar18->DrawDataP).field_0x1 = 0;
      (pIVar18->DrawDataP).CmdListsCount = 0;
      (pIVar18->DrawDataP).TotalIdxCount = 0;
      (pIVar18->DrawDataP).TotalVtxCount = 0;
      lVar52 = lVar52 + 1;
    } while (lVar52 < (pIVar27->Viewports).Size);
  }
  pIVar55 = GImGui;
  if ((pIVar27->DragDropActive != false) &&
     (IVar41 = (pIVar27->DragDropPayload).SourceId, IVar41 == pIVar27->ActiveId)) {
    if (GImGui->ActiveId == IVar41) {
      GImGui->ActiveIdIsAlive = IVar41;
    }
    if (pIVar55->ActiveIdPreviousFrame == IVar41) {
      pIVar55->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar27->HoveredIdPreviousFrame == 0) {
    IVar41 = pIVar27->HoveredId;
    pIVar27->HoveredIdTimer = 0.0;
    pIVar27->HoveredIdNotActiveTimer = 0.0;
    if (IVar41 == 0) goto LAB_0011057d;
LAB_00110556:
    fVar59 = (pIVar27->IO).DeltaTime;
    pIVar27->HoveredIdTimer = pIVar27->HoveredIdTimer + fVar59;
    IVar34 = IVar41;
    if (pIVar27->ActiveId != IVar41) {
      pIVar27->HoveredIdNotActiveTimer = fVar59 + pIVar27->HoveredIdNotActiveTimer;
      IVar34 = pIVar27->ActiveId;
    }
  }
  else {
    IVar41 = pIVar27->HoveredId;
    if (IVar41 != 0) {
      if (pIVar27->ActiveId == IVar41) {
        pIVar27->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00110556;
    }
LAB_0011057d:
    IVar41 = 0;
    IVar34 = pIVar27->ActiveId;
  }
  pIVar27->HoveredIdPreviousFrame = IVar41;
  pIVar27->HoveredIdPreviousFrameUsingMouseWheel = pIVar27->HoveredIdUsingMouseWheel;
  pIVar27->HoveredId = 0;
  pIVar27->HoveredIdAllowOverlap = false;
  pIVar27->HoveredIdUsingMouseWheel = false;
  pIVar27->HoveredIdDisabled = false;
  if (((pIVar27->ActiveIdIsAlive != IVar34) && (IVar34 != 0)) &&
     (pIVar27->ActiveIdPreviousFrame == IVar34)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar34 = pIVar27->ActiveId;
  }
  fVar59 = (pIVar27->IO).DeltaTime;
  if (IVar34 != 0) {
    pIVar27->ActiveIdTimer = pIVar27->ActiveIdTimer + fVar59;
  }
  pIVar27->LastActiveIdTimer = fVar59 + pIVar27->LastActiveIdTimer;
  pIVar27->ActiveIdPreviousFrame = IVar34;
  pIVar27->ActiveIdPreviousFrameWindow = pIVar27->ActiveIdWindow;
  pIVar27->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar27->ActiveIdHasBeenEditedBefore;
  pIVar27->ActiveIdIsAlive = 0;
  pIVar27->ActiveIdHasBeenEditedThisFrame = false;
  pIVar27->ActiveIdPreviousFrameIsAlive = false;
  pIVar27->ActiveIdIsJustActivated = false;
  if (pIVar27->TempInputId == 0) {
LAB_00110669:
    if (IVar34 == 0) {
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[2] = 0;
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[3] = 0;
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[4] = 0;
      pIVar27->ActiveIdUsingNavDirMask = 0;
      pIVar27->ActiveIdUsingNavInputMask = 0;
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[0] = 0;
      (pIVar27->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    }
  }
  else if (IVar34 != pIVar27->TempInputId) {
    pIVar27->TempInputId = 0;
    goto LAB_00110669;
  }
  pIVar27->DragDropAcceptIdPrev = pIVar27->DragDropAcceptIdCurr;
  pIVar27->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar27->DragDropAcceptIdCurr = 0;
  pIVar27->DragDropWithinSource = false;
  pIVar27->DragDropWithinTarget = false;
  pIVar27->DragDropHoldJustPressedId = 0;
  if ((pIVar27->InputEventsTrail).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar19 = (pIVar27->InputEventsTrail).Data;
    if (pIVar19 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar19,(long)(pIVar27->InputEventsTrail).Size * 0x18);
      pIVar19 = (pIVar27->InputEventsTrail).Data;
      if ((pIVar19 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
    }
    (pIVar27->InputEventsTrail).Data = __dest_00;
    (pIVar27->InputEventsTrail).Capacity = 0;
  }
  (pIVar27->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar27->IO).ConfigInputTrickleEventQueue);
  pIVar55 = GImGui;
  cVar11 = (GImGui->IO).BackendUsingLegacyKeyArrays;
  if (cVar11 != '\0') {
    lVar52 = 0;
    do {
      lVar51 = (long)(pIVar55->IO).KeyMap[lVar52 + 0x200];
      if (lVar51 != -1) {
        (pIVar55->IO).KeyMap[lVar51] = (int)lVar52 + 0x200;
      }
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x85);
    bVar56 = cVar11 == '\x01';
    lVar52 = 0;
    do {
      lVar51 = 0;
      while (bVar29 = (pIVar55->IO).KeysDown[lVar51 + lVar52 + 0xb0c + -0xb0c],
            !bVar56 && (bVar29 & 1U) == 0) {
        lVar5 = lVar52 + lVar51;
        lVar51 = lVar51 + 1;
        if (lVar5 == 0x1ff) goto LAB_0011085e;
      }
      uVar33 = (pIVar55->IO).KeyMap[lVar52 + lVar51];
      uVar36 = lVar52 + lVar51;
      uVar54 = uVar36 & 0xffffffff;
      if (uVar33 != 0xffffffff) {
        uVar54 = (ulong)uVar33;
      }
      (pIVar55->IO).KeysData[(int)uVar54].Down = bVar29;
      if (uVar36 != uVar54) {
        (pIVar55->IO).KeysDown[(int)uVar54] =
             (pIVar55->IO).KeysDown[lVar51 + lVar52 + 0xb0c + -0xb0c];
      }
      (pIVar55->IO).BackendUsingLegacyKeyArrays = '\x01';
      lVar52 = lVar52 + lVar51 + 1;
      bVar56 = true;
    } while (uVar36 != 0x1ff);
    bVar56 = (pIVar55->IO).KeyShift;
    (pIVar55->IO).KeysData[0x281].Down = (pIVar55->IO).KeyCtrl;
    (pIVar55->IO).KeysData[0x282].Down = bVar56;
    (pIVar55->IO).KeysData[0x283].Down = (pIVar55->IO).KeyAlt;
    (pIVar55->IO).KeysData[0x284].Down = (pIVar55->IO).KeySuper;
  }
LAB_0011085e:
  bVar56 = (pIVar55->IO).KeyCtrl;
  bVar29 = (pIVar55->IO).KeyShift;
  uVar33 = bVar56 + 2;
  if (bVar29 == false) {
    uVar33 = (uint)bVar56;
  }
  uVar13 = uVar33 + 4;
  if ((pIVar55->IO).KeyAlt == false) {
    uVar13 = uVar33;
  }
  uVar33 = uVar13 + 8;
  if ((pIVar55->IO).KeySuper == false) {
    uVar33 = uVar13;
  }
  (pIVar55->IO).KeyMods = uVar33;
  uVar33 = (pIVar55->IO).BackendFlags;
  if ((uVar33 & 1) == 0) {
    lVar52 = 0;
    do {
      (&(pIVar55->IO).KeysData[0x269].Down)[lVar52] = false;
      *(undefined4 *)((long)&(pIVar55->IO).KeysData[0x269].AnalogValue + lVar52) = 0;
      lVar52 = lVar52 + 0x10;
    } while (lVar52 != 0x180);
  }
  lVar52 = 0xe0c;
  do {
    fVar59 = *(float *)((long)pIVar55 + lVar52 + -4);
    *(float *)(&pIVar55->Initialized + lVar52) = fVar59;
    fVar82 = -1.0;
    if ((*(char *)((long)pIVar55 + lVar52 + -8) == '\x01') && (fVar82 = 0.0, 0.0 <= fVar59)) {
      fVar82 = fVar59 + (pIVar55->IO).DeltaTime;
    }
    *(float *)((long)pIVar55 + lVar52 + -4) = fVar82;
    lVar52 = lVar52 + 0x10;
  } while (lVar52 != 0x365c);
  (pIVar55->IO).WantSetMousePos = false;
  uVar13 = (pIVar55->IO).ConfigFlags;
  uVar33 = uVar33 & (uVar13 & 2) >> 1;
  if ((uVar33 == 1) && ((pIVar55->IO).BackendUsingLegacyNavInputArray == false)) {
    fVar59 = (pIVar55->IO).KeysData[0x26c].AnalogValue;
    (pIVar55->IO).NavInputs[0] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x26e].AnalogValue;
    (pIVar55->IO).NavInputs[1] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x26d].AnalogValue;
    (pIVar55->IO).NavInputs[3] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x26b].AnalogValue;
    (pIVar55->IO).NavInputs[2] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x271].AnalogValue;
    (pIVar55->IO).NavInputs[4] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x272].AnalogValue;
    (pIVar55->IO).NavInputs[5] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x26f].AnalogValue;
    (pIVar55->IO).NavInputs[6] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x270].AnalogValue;
    (pIVar55->IO).NavInputs[7] = fVar59;
    if (0.0 < fVar59) {
      pIVar55->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar59 = (pIVar55->IO).KeysData[0x273].AnalogValue;
    fVar82 = (pIVar55->IO).KeysData[0x274].AnalogValue;
    (pIVar55->IO).NavInputs[0xc] = fVar59;
    (pIVar55->IO).NavInputs[0xd] = fVar82;
    (pIVar55->IO).NavInputs[0xe] = fVar59;
    (pIVar55->IO).NavInputs[0xf] = fVar82;
    (pIVar55->IO).NavInputs[8] = (pIVar55->IO).KeysData[0x27b].AnalogValue;
    (pIVar55->IO).NavInputs[9] = (pIVar55->IO).KeysData[0x27c].AnalogValue;
    (pIVar55->IO).NavInputs[10] = (pIVar55->IO).KeysData[0x279].AnalogValue;
    (pIVar55->IO).NavInputs[0xb] = (pIVar55->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar13 & 1) != 0) {
    if ((pIVar55->IO).KeysData[0x20c].Down == true) {
      (pIVar55->IO).NavInputs[0] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x20d].Down == true) {
      (pIVar55->IO).NavInputs[2] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x20e].Down == true) {
      (pIVar55->IO).NavInputs[1] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x201].Down == true) {
      (pIVar55->IO).NavInputs[0x10] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x202].Down == true) {
      (pIVar55->IO).NavInputs[0x11] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x203].Down == true) {
      (pIVar55->IO).NavInputs[0x12] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar55->IO).KeysData[0x204].Down == true) {
      (pIVar55->IO).NavInputs[0x13] = 1.0;
      pIVar55->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar56 != false) {
      (pIVar55->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar29 != false) {
      (pIVar55->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar1 = (pIVar55->IO).NavInputsDownDuration;
  pfVar46 = pfVar1;
  pfVar47 = (pIVar55->IO).NavInputsDownDurationPrev;
  for (lVar52 = 0x14; lVar52 != 0; lVar52 = lVar52 + -1) {
    *pfVar47 = *pfVar46;
    pfVar46 = pfVar46 + (ulong)bVar57 * -2 + 1;
    pfVar47 = pfVar47 + (ulong)bVar57 * -2 + 1;
  }
  lVar52 = 0;
  do {
    fVar59 = -1.0;
    if (0.0 < (pIVar55->IO).NavInputs[lVar52]) {
      fVar59 = 0.0;
      if (0.0 <= pfVar1[lVar52]) {
        fVar59 = pfVar1[lVar52] + (pIVar55->IO).DeltaTime;
      }
    }
    pfVar1[lVar52] = fVar59;
    lVar52 = lVar52 + 1;
  } while (lVar52 != 0x14);
  if (pIVar55->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar55->NavInitRequest = false;
  pIVar55->NavInitRequestFromMove = false;
  pIVar55->NavInitResultId = 0;
  pIVar55->NavJustMovedToId = 0;
  if (pIVar55->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar55->NavTabbingCounter = 0;
  pIVar55->NavMoveSubmitted = false;
  pIVar55->NavMoveScoringItems = false;
  if ((((pIVar55->NavMousePosDirty == true) && (pIVar55->NavIdIsAlive == true)) &&
      (pIVar55->NavDisableHighlight == false)) && (pIVar55->NavDisableMouseHover == true)) {
    bVar56 = pIVar55->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar56 = false;
  }
  pIVar55->NavMousePosDirty = false;
  pIVar37 = pIVar55->NavWindow;
  pIVar43 = pIVar37;
  if (pIVar37 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar43->RootWindow == pIVar43) || ((pIVar43->Flags & 0x14000000) != 0)) {
        if (pIVar43 != pIVar37) {
          pIVar43->NavLastChildNavWindow = pIVar37;
        }
        break;
      }
      ppIVar2 = &pIVar43->ParentWindow;
      pIVar43 = *ppIVar2;
    } while (*ppIVar2 != (ImGuiWindow *)0x0);
    if ((pIVar37->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar55->NavLayer == ImGuiNavLayer_Main)) {
      pIVar37->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar53 = GImGui;
  pIVar37 = GetTopMostPopupModal();
  if (pIVar37 != (ImGuiWindow *)0x0) {
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar53->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar59 = (pIVar53->IO).DeltaTime * -10.0 + pIVar53->NavWindowingHighlightAlpha;
    fVar59 = (float)(-(uint)(0.0 <= fVar59) & (uint)fVar59);
    pIVar53->NavWindowingHighlightAlpha = fVar59;
    if ((pIVar53->DimBgRatio <= 0.0) && (fVar59 <= 0.0)) {
      pIVar53->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar37 == (ImGuiWindow *)0x0) && (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar29 = (bool)(-((pIVar53->IO).NavInputsDownDuration[3] == 0.0) & 1);
    if ((pIVar53->IO).KeyCtrl != true) goto LAB_00110dbb;
    bVar30 = IsKeyPressed(0x200,true);
  }
  else {
    bVar29 = false;
LAB_00110dbb:
    bVar30 = false;
  }
  if (((bVar29 | bVar30) == 1) &&
     ((pIVar37 = pIVar53->NavWindow, pIVar37 != (ImGuiWindow *)0x0 ||
      (pIVar37 = FindWindowNavFocusable((pIVar53->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar37 != (ImGuiWindow *)0x0)))) {
    pIVar37 = pIVar37->RootWindow;
    pIVar53->NavWindowingTargetAnim = pIVar37;
    pIVar53->NavWindowingTarget = pIVar37;
    pIVar53->NavWindowingTimer = 0.0;
    pIVar53->NavWindowingHighlightAlpha = 0.0;
    pIVar53->NavWindowingToggleLayer = bVar29;
    pIVar53->NavInputSource = bVar30 ^ ImGuiInputSource_Gamepad;
  }
  fVar59 = (pIVar53->IO).DeltaTime + pIVar53->NavWindowingTimer;
  pIVar53->NavWindowingTimer = fVar59;
  if (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00111021:
    bVar29 = false;
    pIVar37 = (ImGuiWindow *)0x0;
  }
  else {
    IVar35 = pIVar53->NavInputSource;
    if (IVar35 != ImGuiInputSource_Gamepad) {
LAB_00110f8a:
      if (IVar35 == ImGuiInputSource_Keyboard) {
        fVar82 = (pIVar53->NavWindowingTimer + -0.2) / 0.05;
        fVar59 = 1.0;
        if (fVar82 <= 1.0) {
          fVar59 = fVar82;
        }
        fVar59 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar59);
        uVar58 = -(uint)(fVar59 <= pIVar53->NavWindowingHighlightAlpha);
        pIVar53->NavWindowingHighlightAlpha =
             (float)(uVar58 & (uint)pIVar53->NavWindowingHighlightAlpha | ~uVar58 & (uint)fVar59);
        bVar29 = IsKeyPressed(0x200,true);
        if (bVar29) {
          NavUpdateWindowingHighlightWindow((pIVar53->IO).KeyShift - 1 | 1);
        }
        if ((pIVar53->IO).KeyCtrl == false) {
          pIVar37 = pIVar53->NavWindowingTarget;
          bVar29 = false;
          goto LAB_00111026;
        }
      }
      goto LAB_00111021;
    }
    fVar82 = (fVar59 + -0.2) / 0.05;
    fVar59 = 1.0;
    if (fVar82 <= 1.0) {
      fVar59 = fVar82;
    }
    fVar59 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar59);
    uVar58 = -(uint)(fVar59 <= pIVar53->NavWindowingHighlightAlpha);
    fVar71 = (float)(uVar58 & (uint)pIVar53->NavWindowingHighlightAlpha | ~uVar58 & (uint)fVar59);
    pIVar53->NavWindowingHighlightAlpha = fVar71;
    fVar59 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar82 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar45 = (uint)(0.0 < fVar59) - (uint)(0.0 < fVar82);
    pIVar38 = pIVar53;
    if (iVar45 != 0) {
      NavUpdateWindowingHighlightWindow(iVar45);
      pIVar53->NavWindowingHighlightAlpha = 1.0;
      fVar71 = 1.0;
      pIVar38 = GImGui;
    }
    if (0.0 < (pIVar38->IO).NavInputs[3]) {
      if (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00111021;
      IVar35 = pIVar53->NavInputSource;
      goto LAB_00110f8a;
    }
    pbVar48 = &pIVar53->NavWindowingToggleLayer;
    *pbVar48 = (bool)(*pbVar48 & fVar71 < 1.0);
    if (*pbVar48 == false) {
      pIVar37 = pIVar53->NavWindowingTarget;
      bVar29 = false;
    }
    else {
      bVar29 = pIVar53->NavWindow != (ImGuiWindow *)0x0;
      pIVar37 = (ImGuiWindow *)0x0;
    }
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00111026:
  if ((((pIVar53->IO).ConfigFlags & 1) != 0) && (bVar30 = IsKeyPressed(0x283,true), bVar30)) {
    pIVar53->NavWindowingToggleLayer = true;
    pIVar53->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar53->NavWindowingToggleLayer == true) &&
     (pIVar53->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar53->IO).InputQueueCharacters.Size) ||
       ((((pIVar53->IO).KeyCtrl != false || ((pIVar53->IO).KeyShift != false)) ||
        (bVar30 = true, (pIVar53->IO).KeySuper == true)))) {
      pIVar53->NavWindowingToggleLayer = false;
      bVar30 = false;
    }
    bVar31 = (GImGui->IO).KeysData[0x283].Down;
    if (0.0 <= (GImGui->IO).KeysData[0x283].DownDurationPrev) {
      if ((bVar31 & 1U) == 0) {
        if ((bVar30) && ((pIVar53->ActiveId == 0 || (pIVar53->ActiveIdAllowOverlap == true)))) {
          bVar29 = (bool)(((pIVar53->IO).MousePosPrev.y < -256000.0 ||
                          (pIVar53->IO).MousePosPrev.x < -256000.0) !=
                          (-256000.0 <= (pIVar53->IO).MousePos.x &&
                          -256000.0 <= (pIVar53->IO).MousePos.y) | bVar29);
        }
        goto LAB_00111189;
      }
    }
    else if ((bVar31 & 1U) == 0) {
LAB_00111189:
      pIVar53->NavWindowingToggleLayer = false;
    }
  }
  pIVar43 = pIVar53->NavWindowingTarget;
  if ((pIVar43 != (ImGuiWindow *)0x0) && ((pIVar43->Flags & 4) == 0)) {
    if (pIVar53->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar60 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar60.x = 0.0;
      IVar60.y = 0.0;
      if ((pIVar53->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar53->IO).KeyShift == false)) {
        IVar60.x = (float)(int)(GImGui->IO).KeysData[0x202].Down -
                   (float)(int)(GImGui->IO).KeysData[0x201].Down;
        IVar60.y = (float)(int)(GImGui->IO).KeysData[0x204].Down -
                   (float)(int)(GImGui->IO).KeysData[0x203].Down;
      }
    }
    fVar59 = IVar60.y;
    if (((IVar60.x != 0.0) || (fVar59 != 0.0)) || (NAN(fVar59))) {
      fVar82 = (pIVar53->IO).DisplayFramebufferScale.x;
      fVar71 = (pIVar53->IO).DisplayFramebufferScale.y;
      if (fVar71 <= fVar82) {
        fVar82 = fVar71;
      }
      fVar82 = (float)(int)(fVar82 * (pIVar53->IO).DeltaTime * 800.0);
      pIVar43 = pIVar43->RootWindow;
      local_48.Min.x = (pIVar43->Pos).x + IVar60.x * fVar82;
      local_48.Min.y = (pIVar43->Pos).y + fVar59 * fVar82;
      SetWindowPos(pIVar43,&local_48.Min,1);
      if (((pIVar43->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar53->NavDisableMouseHover = true;
    }
  }
  if (pIVar37 != (ImGuiWindow *)0x0) {
    if ((pIVar53->NavWindow == (ImGuiWindow *)0x0) || (pIVar37 != pIVar53->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar38 = GImGui;
      pIVar38->NavMousePosDirty = true;
      pIVar38->NavDisableHighlight = false;
      pIVar38->NavDisableMouseHover = true;
      pIVar43 = pIVar37->NavLastChildNavWindow;
      if ((pIVar43 == (ImGuiWindow *)0x0) || (pIVar43->WasActive == false)) {
        pIVar43 = pIVar37;
      }
      ClosePopupsOverWindow(pIVar43,false);
      FocusWindow(pIVar43);
      if (pIVar43->NavLastIds[0] == 0) {
        NavInitWindow(pIVar43,false);
      }
      if ((pIVar43->DC).NavLayersActiveMaskNext == 2) {
        pIVar53->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar29) && (pIVar53->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar37 = pIVar53->NavWindow;
    pIVar43 = pIVar37;
    do {
      window = pIVar43;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar43 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar37) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar37;
      pIVar37 = pIVar53->NavWindow;
    }
    IVar14 = pIVar53->NavLayer;
    if (((pIVar37->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar14 == ImGuiNavLayer_Main) goto LAB_00111460;
    }
    else if (IVar14 == ImGuiNavLayer_Main) {
      pIVar37->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar14 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar53 = GImGui;
    pIVar53->NavMousePosDirty = true;
    pIVar53->NavDisableHighlight = false;
    pIVar53->NavDisableMouseHover = true;
  }
LAB_00111460:
  local_88 = (char)uVar33;
  if (((uVar13 & 1) == 0 && local_88 == '\0') || (pIVar55->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar55->IO).NavActive = false;
LAB_001114a8:
    bVar29 = pIVar55->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar29 = (pIVar55->NavWindow->Flags & 0x40000U) == 0;
    (pIVar55->IO).NavActive = bVar29;
    if (((!bVar29) || (pIVar55->NavId == 0)) ||
       (bVar29 = true, pIVar55->NavDisableHighlight != false)) goto LAB_001114a8;
  }
  (pIVar55->IO).NavVisible = bVar29;
  pIVar53 = GImGui;
  fVar59 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar59 == 0.0) && (!NAN(fVar59))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar37 = GImGui->NavWindow;
        if (pIVar37 == (ImGuiWindow *)0x0) {
          uVar33 = (GImGui->OpenPopupStack).Size;
          if ((int)uVar33 < 1) goto LAB_00112e78;
LAB_00112d9b:
          if ((((GImGui->OpenPopupStack).Data[(ulong)uVar33 - 1].Window)->Flags & 0x8000000) == 0) {
            ClosePopupToLevel(uVar33 - 1,true);
          }
        }
        else if (((pIVar37 == pIVar37->RootWindow) || ((pIVar37->Flags & 0x4000000) != 0)) ||
                (pIVar43 = pIVar37->ParentWindow, pIVar43 == (ImGuiWindow *)0x0)) {
          uVar33 = (GImGui->OpenPopupStack).Size;
          if (0 < (int)uVar33) goto LAB_00112d9b;
          if ((pIVar37->Flags & 0x5000000U) != 0x1000000) {
            pIVar37->NavLastIds[0] = 0;
          }
LAB_00112e78:
          pIVar53->NavId = 0;
          pIVar53->NavFocusScopeId = 0;
        }
        else {
          IVar62 = pIVar37->Size;
          fVar71 = (pIVar37->Pos).x;
          fVar83 = (pIVar37->Pos).y;
          FocusWindow(pIVar43);
          pIVar53 = GImGui;
          IVar41 = pIVar37->ChildId;
          IVar60 = (pIVar43->DC).CursorStartPos;
          fVar59 = IVar60.x;
          IVar68.x = fVar71 - fVar59;
          fVar82 = IVar60.y;
          IVar68.y = fVar83 - fVar82;
          IVar75.x = (IVar62.x + fVar71) - fVar59;
          IVar75.y = (IVar62.y + fVar83) - fVar82;
          GImGui->NavId = IVar41;
          pIVar53->NavLayer = ImGuiNavLayer_Main;
          pIVar53->NavFocusScopeId = 0;
          pIVar37 = pIVar53->NavWindow;
          pIVar37->NavLastIds[0] = IVar41;
          pIVar37->NavRectRel[0].Min = IVar68;
          pIVar37->NavRectRel[0].Max = IVar75;
          pIVar53->NavMousePosDirty = true;
          pIVar53->NavDisableHighlight = false;
          pIVar53->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar53 = GImGui;
        pIVar53->NavMousePosDirty = true;
        pIVar53->NavDisableHighlight = false;
        pIVar53->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar55->NavActivateId = 0;
  pIVar55->NavActivateDownId = 0;
  pIVar55->NavActivatePressedId = 0;
  pIVar55->NavActivateInputId = 0;
  pIVar55->NavActivateFlags = 0;
  IVar41 = pIVar55->NavId;
  if (((IVar41 == 0) || (pIVar55->NavDisableHighlight != false)) ||
     (pIVar55->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_00111554:
    if ((pIVar55->NavWindow != (ImGuiWindow *)0x0) && ((pIVar55->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar55->NavDisableHighlight = true;
    }
  }
  else if (pIVar55->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar55->NavWindow->Flags & 0x40000) != 0) goto LAB_00111554;
    fVar59 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar59) {
      bVar29 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar29 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar30 = false;
    }
    else {
      bVar30 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar34 = pIVar55->ActiveId;
    if (bVar29 && IVar34 == 0) {
      pIVar55->NavActivateId = IVar41;
      pIVar55->NavActivateFlags = 2;
LAB_00112f31:
      if (bVar30) {
        pIVar55->NavActivateInputId = IVar41;
        pIVar55->NavActivateFlags = 1;
      }
      if (0.0 < fVar59) {
        pIVar55->NavActivateDownId = IVar41;
      }
    }
    else {
      if (IVar34 == 0) goto LAB_00112f31;
      if ((bool)(bVar30 & IVar34 == IVar41)) {
        pIVar55->NavActivateInputId = IVar41;
        pIVar55->NavActivateFlags = 1;
      }
      if (IVar34 == IVar41 && 0.0 < fVar59) {
        pIVar55->NavActivateDownId = IVar41;
      }
      bVar29 = (bool)(bVar29 & IVar34 == IVar41);
    }
    if (bVar29) {
      pIVar55->NavActivatePressedId = IVar41;
    }
    goto LAB_00111554;
  }
  IVar41 = pIVar55->NavNextActivateId;
  if (IVar41 != 0) {
    if ((pIVar55->NavNextActivateFlags & 1U) == 0) {
      pIVar55->NavActivatePressedId = IVar41;
      pIVar55->NavActivateDownId = IVar41;
      pIVar55->NavActivateId = IVar41;
    }
    else {
      pIVar55->NavActivateInputId = IVar41;
    }
    pIVar55->NavActivateFlags = pIVar55->NavNextActivateFlags;
  }
  pIVar55->NavNextActivateId = 0;
  pIVar53 = GImGui;
  pIVar37 = GImGui->NavWindow;
  if ((pIVar37 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    IVar49 = GImGui->NavMoveDir;
LAB_0011175b:
    fVar59 = 0.0;
    if ((((IVar49 != -1) || (((pIVar53->IO).ConfigFlags & 1U) == 0)) ||
        ((pIVar37->Flags & 0x40000) != 0)) || (pIVar53->NavWindowingTarget != (ImGuiWindow *)0x0))
    goto LAB_00111811;
    bVar29 = false;
    bVar30 = false;
    if ((pIVar53->IO).KeysData[0x205].Down == true) {
      bVar30 = ((pIVar53->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
    }
    if ((pIVar53->IO).KeysData[0x206].Down == true) {
      bVar29 = ((pIVar53->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
    }
    bVar31 = IsKeyPressed(0x207,true);
    if (bVar31) {
      bVar31 = ((pIVar53->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0;
    }
    else {
      bVar31 = false;
    }
    bVar32 = IsKeyPressed(0x208,true);
    if (bVar32) {
      bVar32 = ((pIVar53->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0;
    }
    else {
      bVar32 = false;
    }
    fVar59 = 0.0;
    if ((bVar30 == bVar29) && (bVar31 == bVar32)) goto LAB_00111811;
    if (pIVar53->NavLayer != ImGuiNavLayer_Main) {
      NavRestoreLayer(ImGuiNavLayer_Main);
    }
    if (((pIVar37->DC).NavLayersActiveMask == 0) && ((pIVar37->DC).NavHasScroll == true)) {
      bVar29 = IsKeyPressed(0x205,true);
      if (bVar29) {
        fVar59 = (pIVar37->Scroll).y - ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y);
      }
      else {
        bVar29 = IsKeyPressed(0x206,true);
        if (!bVar29) {
          fVar59 = 0.0;
          if (bVar31 == false) {
            if (bVar32 == false) goto LAB_00111811;
            (pIVar37->ScrollTarget).y = (pIVar37->ScrollMax).y;
          }
          else {
            (pIVar37->ScrollTarget).y = 0.0;
          }
          (pIVar37->ScrollTargetCenterRatio).y = 0.0;
          (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
          goto LAB_00111811;
        }
        fVar59 = ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) + (pIVar37->Scroll).y;
      }
      (pIVar37->ScrollTarget).y = fVar59;
      (pIVar37->ScrollTargetCenterRatio).y = 0.0;
      (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
      goto LAB_0011180e;
    }
    IVar14 = pIVar53->NavLayer;
    pIVar50 = pIVar37->NavRectRel + IVar14;
    fVar59 = GImGui->FontBaseSize * pIVar37->FontWindowScale;
    if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
      fVar59 = fVar59 * pIVar37->ParentWindow->FontWindowScale;
    }
    fVar59 = (pIVar37->NavRectRel[IVar14].Max.y - pIVar37->NavRectRel[IVar14].Min.y) +
             (((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) - fVar59);
    fVar59 = (float)(~-(uint)(fVar59 <= 0.0) & (uint)fVar59);
    bVar29 = IsKeyPressed(0x205,true);
    if (bVar29) {
      fVar59 = -fVar59;
      IVar49 = 2;
      IVar42 = 3;
LAB_00112f91:
      pIVar53->NavMoveDir = IVar42;
      pIVar53->NavMoveClipDir = IVar49;
      pIVar53->NavMoveFlags = 0x30;
      if ((fVar59 != 0.0) || (NAN(fVar59))) {
        IVar62 = (pIVar37->InnerRect).Max;
        (pIVar53->NavScoringNoClipRect).Min = (pIVar37->InnerRect).Min;
        (pIVar53->NavScoringNoClipRect).Max = IVar62;
        (pIVar53->NavScoringNoClipRect).Min.y = (pIVar53->NavScoringNoClipRect).Min.y + fVar59;
        (pIVar53->NavScoringNoClipRect).Max.y = (pIVar53->NavScoringNoClipRect).Max.y + fVar59;
      }
      goto LAB_00111811;
    }
    bVar29 = IsKeyPressed(0x206,true);
    if (bVar29) {
      IVar49 = 3;
      IVar42 = 2;
      goto LAB_00112f91;
    }
    if (bVar31 == false) {
      fVar59 = 0.0;
      if (bVar32 == false) goto LAB_00111811;
      fVar59 = (pIVar37->ContentSize).y;
      pIVar37->NavRectRel[IVar14].Max.y = fVar59;
      pIVar37->NavRectRel[IVar14].Min.y = fVar59;
      fVar59 = (pIVar50->Min).x;
      iVar45 = 2;
    }
    else {
      pIVar37->NavRectRel[IVar14].Max.y = 0.0;
      pIVar37->NavRectRel[IVar14].Min.y = 0.0;
      fVar59 = (pIVar50->Min).x;
      iVar45 = 3;
    }
    pIVar3 = &pIVar37->NavRectRel[IVar14].Max;
    if (pIVar3->x <= fVar59 && fVar59 != pIVar3->x) {
      pIVar37->NavRectRel[IVar14].Max.x = 0.0;
      (pIVar50->Min).x = 0.0;
    }
    pIVar53->NavMoveDir = iVar45;
    pIVar53->NavMoveFlags = 0x50;
    pIVar53->NavMoveForwardToNextFrame = false;
    fVar59 = 0.0;
    move_flags = 0x50;
LAB_00111831:
    NavMoveRequestSubmit(iVar45,pIVar53->NavMoveClipDir,move_flags,pIVar53->NavMoveScrollFlags);
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar53->NavMoveFlags = 0;
    pIVar53->NavMoveScrollFlags = 0;
    if (pIVar37 != (ImGuiWindow *)0x0) {
      IVar49 = -1;
      if ((pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar37->Flags & 0x40000) == 0))
      {
        uVar33 = pIVar53->ActiveIdUsingNavDirMask;
        if (((uVar33 & 1) == 0) &&
           ((fVar59 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
            (fVar59 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
          pIVar53->NavMoveDir = 0;
          IVar49 = 0;
        }
        if (((uVar33 & 2) == 0) &&
           ((fVar59 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
            (fVar59 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
          pIVar53->NavMoveDir = 1;
          IVar49 = 1;
        }
        if (((uVar33 & 4) == 0) &&
           ((fVar59 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
            (fVar59 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
          pIVar53->NavMoveDir = 2;
          IVar49 = 2;
        }
        if (((uVar33 & 8) == 0) &&
           ((fVar59 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar59 ||
            (fVar59 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar59)))) {
          pIVar53->NavMoveDir = 3;
          IVar49 = 3;
        }
      }
      pIVar53->NavMoveClipDir = IVar49;
      (pIVar53->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      goto LAB_0011175b;
    }
    pIVar53->NavMoveClipDir = -1;
    (pIVar53->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_0011180e:
    fVar59 = 0.0;
LAB_00111811:
    iVar45 = pIVar53->NavMoveDir;
    pIVar53->NavMoveForwardToNextFrame = false;
    if (iVar45 != -1) {
      move_flags = pIVar53->NavMoveFlags;
      goto LAB_00111831;
    }
  }
  if (pIVar53->NavMoveSubmitted == true) {
    if (pIVar53->NavId == 0) {
      pIVar53->NavInitRequest = true;
      pIVar53->NavInitRequestFromMove = true;
      pIVar53->NavInitResultId = 0;
      pIVar53->NavDisableHighlight = false;
    }
    if ((pIVar53->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar53->NavLayer != ImGuiNavLayer_Main || pIVar37 == (ImGuiWindow *)0x0))
    goto LAB_001119d1;
    iVar84 = -(uint)((pIVar53->NavMoveFlags & 5U) == 0);
    register0x00001284 = -(uint)((pIVar53->NavMoveFlags & 10U) == 0);
    auVar76._8_4_ = 0xffffffff;
    auVar76._12_4_ = 0xffffffff;
    auVar70._4_4_ = register0x00001284;
    auVar70._0_4_ = register0x00001284;
    auVar70._8_4_ = register0x00001284;
    auVar70._12_4_ = register0x00001284;
    if (((auVar70 | auVar76) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      IVar62 = (pIVar37->DC).CursorStartPos;
      fVar82 = IVar62.x;
      auVar66._0_4_ = ((pIVar37->InnerRect).Min.x + -1.0) - fVar82;
      fVar71 = IVar62.y;
      auVar66._4_4_ = ((pIVar37->InnerRect).Min.y + -1.0) - fVar71;
      auVar66._8_4_ = ((pIVar37->InnerRect).Max.x + 1.0) - fVar82;
      auVar66._12_4_ = ((pIVar37->InnerRect).Max.y + 1.0) - fVar71;
      if ((((pIVar37->NavRectRel[0].Min.x < auVar66._0_4_) ||
           (pIVar37->NavRectRel[0].Min.y < auVar66._4_4_)) ||
          (auVar66._8_4_ < pIVar37->NavRectRel[0].Max.x)) ||
         (auVar66._12_4_ < pIVar37->NavRectRel[0].Max.y)) {
        auVar77._0_8_ = CONCAT44(register0x00001284,iVar84);
        auVar77._8_4_ = iVar84;
        auVar77._12_4_ = register0x00001284;
        auVar69._0_4_ = auVar66._8_4_ - auVar66._0_4_;
        auVar69._4_4_ = auVar66._12_4_ - auVar66._4_4_;
        fVar82 = GImGui->FontBaseSize * pIVar37->FontWindowScale;
        if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
          fVar82 = fVar82 * pIVar37->ParentWindow->FontWindowScale;
        }
        auVar80._0_4_ = fVar82 * 0.5;
        auVar80._4_4_ = auVar80._0_4_;
        auVar80._8_4_ = auVar80._0_4_;
        auVar80._12_4_ = auVar80._0_4_;
        auVar69._8_4_ = auVar69._0_4_;
        auVar69._12_4_ = auVar69._4_4_;
        auVar70 = minps(auVar69,auVar80);
        auVar25._4_8_ = auVar66._8_8_;
        auVar25._0_4_ = auVar66._4_4_ - auVar70._4_4_;
        auVar67._0_8_ = auVar25._0_8_ << 0x20;
        auVar67._8_4_ = auVar66._8_4_ - auVar70._8_4_;
        auVar67._12_4_ = auVar66._12_4_ - auVar70._12_4_;
        local_48.Min = (ImVec2)(~auVar77._0_8_ & 0xff7fffffff7fffff |
                               CONCAT44(auVar66._4_4_ + auVar70._4_4_,auVar66._0_4_ + auVar70._0_4_)
                               & auVar77._0_8_);
        local_48.Max = (ImVec2)(~auVar77._8_8_ & 0x7f7fffff7f7fffff | auVar67._8_8_ & auVar77._8_8_)
        ;
        ImRect::ClipWithFull(pIVar37->NavRectRel,&local_48);
        pIVar53->NavId = 0;
        pIVar53->NavFocusScopeId = 0;
      }
    }
LAB_001119da:
    IVar14 = pIVar53->NavLayer;
    fVar82 = pIVar37->NavRectRel[IVar14].Min.x;
    fVar71 = pIVar37->NavRectRel[IVar14].Max.x;
    if (fVar71 < fVar82) {
LAB_00111a13:
      fVar72 = 0.0;
      fVar71 = 0.0;
      fVar83 = 0.0;
      fVar82 = 0.0;
    }
    else {
      fVar83 = pIVar37->NavRectRel[IVar14].Min.y;
      fVar72 = pIVar37->NavRectRel[IVar14].Max.y;
      if (fVar72 < fVar83) goto LAB_00111a13;
    }
    fVar8 = (pIVar37->DC).CursorStartPos.x;
    fVar9 = (pIVar37->DC).CursorStartPos.y;
    fVar71 = fVar71 + fVar8;
    fVar82 = fVar82 + fVar8 + 1.0;
    if (fVar71 <= fVar82) {
      fVar82 = fVar71;
    }
    IVar74.y = fVar83 + fVar9 + fVar59;
    IVar74.x = fVar82;
    IVar61.y = fVar72 + fVar9 + fVar59;
    IVar61.x = fVar82;
  }
  else {
LAB_001119d1:
    if (pIVar37 != (ImGuiWindow *)0x0) goto LAB_001119da;
    IVar61.x = 0.0;
    IVar61.y = 0.0;
    IVar74.x = 0.0;
    IVar74.y = 0.0;
  }
  (pIVar53->NavScoringRect).Min = IVar74;
  (pIVar53->NavScoringRect).Max = IVar61;
  if (IVar74.x < (pIVar53->NavScoringNoClipRect).Min.x) {
    (pIVar53->NavScoringNoClipRect).Min.x = IVar74.x;
  }
  if (IVar74.y < (pIVar53->NavScoringNoClipRect).Min.y) {
    (pIVar53->NavScoringNoClipRect).Min.y = IVar74.y;
  }
  pIVar3 = &(pIVar53->NavScoringNoClipRect).Max;
  fVar59 = IVar61.x;
  if (pIVar3->x <= fVar59 && fVar59 != pIVar3->x) {
    (pIVar53->NavScoringNoClipRect).Max.x = fVar59;
  }
  fVar59 = IVar61.y;
  pfVar1 = &(pIVar53->NavScoringNoClipRect).Max.y;
  if (*pfVar1 <= fVar59 && fVar59 != *pfVar1) {
    (pIVar53->NavScoringNoClipRect).Max.y = fVar59;
  }
  pIVar53 = GImGui;
  if (((((pIVar55->NavMoveDir == -1) && (pIVar37 = GImGui->NavWindow, pIVar37 != (ImGuiWindow *)0x0)
        ) && ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
              (((pIVar37->Flags & 0x40000) == 0 && (bVar29 = IsKeyPressed(0x200,true), bVar29))))))
      && (((pIVar53->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)) &&
     (((pIVar53->IO).KeyCtrl == false && ((pIVar53->IO).KeyAlt == false)))) {
    if ((pIVar53->IO).KeyShift == false) {
      uVar33 = (uint)(pIVar53->ActiveId != 0);
      IVar49 = 3;
    }
    else {
      IVar49 = 2;
      uVar33 = 0xffffffff;
    }
    scroll_flags = 3;
    if (pIVar37->Appearing != false) {
      scroll_flags = 0x21;
    }
    pIVar53->NavTabbingDir = uVar33;
    NavMoveRequestSubmit(-1,IVar49,0x400,scroll_flags);
    (pIVar53->NavTabbingResultFirst).InFlags = 0;
    (pIVar53->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar53->NavTabbingResultFirst).ID = 0;
    (pIVar53->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar53->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    (pIVar53->NavTabbingResultFirst).DistBox = 3.4028235e+38;
    (pIVar53->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
    pIVar53->NavTabbingCounter = -1;
    pIVar53 = GImGui;
  }
  bVar29 = true;
  if (pIVar53->NavMoveScoringItems == false) {
    bVar29 = pIVar53->NavInitRequest;
  }
  pIVar53->NavAnyRequest = bVar29;
  pIVar55->NavIdIsAlive = false;
  pIVar37 = pIVar55->NavWindow;
  if (((pIVar37 != (ImGuiWindow *)0x0) && ((pIVar37->Flags & 0x40000) == 0)) &&
     (pIVar55->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar59 = pIVar53->FontBaseSize * pIVar37->FontWindowScale;
    if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
      fVar59 = fVar59 * pIVar37->ParentWindow->FontWindowScale;
    }
    fVar59 = (float)(int)(fVar59 * 100.0 * (pIVar55->IO).DeltaTime + 0.5);
    if (((pIVar37->DC).NavLayersActiveMask == 0) &&
       (uVar33 = pIVar55->NavMoveDir, (uVar33 != 0xffffffff & (pIVar37->DC).NavHasScroll) == 1)) {
      if (uVar33 < 2) {
        (pIVar37->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0017c530 + (ulong)(uVar33 == 0) * 4) * fVar59 +
                         (pIVar37->Scroll).x);
        (pIVar37->ScrollTargetCenterRatio).x = 0.0;
        (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar33 & 0xfffffffe) == 2) {
        (pIVar37->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0017c530 + (ulong)(uVar33 == 2) * 4) * fVar59 +
                         (pIVar37->Scroll).y);
        (pIVar37->ScrollTargetCenterRatio).y = 0.0;
        (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar62 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar82 = IVar62.x;
    fVar71 = IVar62.y;
    if (((fVar82 != 0.0) || (NAN(fVar82))) && (pIVar37->ScrollbarX == true)) {
      (pIVar37->ScrollTarget).x = (float)(int)(fVar82 * fVar59 + (pIVar37->Scroll).x);
      (pIVar37->ScrollTargetCenterRatio).x = 0.0;
      (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar71 != 0.0) || (NAN(fVar71))) {
      (pIVar37->ScrollTarget).y = (float)(int)(fVar71 * fVar59 + (pIVar37->Scroll).y);
      (pIVar37->ScrollTargetCenterRatio).y = 0.0;
      (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar13 & 1) == 0 && local_88 == '\0') {
    pIVar55->NavDisableHighlight = true;
    pIVar55->NavDisableMouseHover = false;
  }
  else if (((bVar56) && (((pIVar55->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar55->IO).BackendFlags & 4) != 0)) {
    IVar62 = NavCalcPreferredRefPos();
    (pIVar55->IO).MousePosPrev = IVar62;
    (pIVar55->IO).MousePos = IVar62;
    (pIVar55->IO).WantSetMousePos = true;
    pIVar53 = GImGui;
  }
  pIVar55->NavScoringDebugCount = 0;
  IVar63 = (pIVar53->IO).MousePos;
  fVar59 = IVar63.x;
  if ((-256000.0 <= fVar59) && (fVar82 = IVar63.y, -256000.0 <= fVar82)) {
    IVar63.x = (float)(int)((int)fVar59 - (uint)((float)(int)fVar59 != fVar59 && fVar59 < 0.0));
    IVar63.y = (float)(int)((int)fVar82 - (uint)((float)(int)fVar82 != fVar82 && fVar82 < 0.0));
    pIVar53->MouseLastValidPos = IVar63;
    (pIVar53->IO).MousePos = IVar63;
  }
  fVar59 = IVar63.y;
  if ((IVar63.x < -256000.0) || (fVar59 < -256000.0)) {
LAB_00111dcb:
    (pIVar53->IO).MouseDelta.x = 0.0;
    (pIVar53->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar62 = (pIVar53->IO).MousePosPrev;
    fVar82 = IVar62.x;
    if ((fVar82 < -256000.0) || (fVar71 = IVar62.y, fVar71 < -256000.0)) goto LAB_00111dcb;
    IVar79.x = IVar63.x - fVar82;
    IVar79.y = fVar59 - fVar71;
    (pIVar53->IO).MouseDelta = IVar79;
    if ((((IVar79.x != 0.0) || (NAN(IVar79.x))) || (IVar79.y != 0.0)) || (NAN(IVar79.y))) {
      pIVar53->NavDisableMouseHover = false;
    }
  }
  IVar62 = (pIVar53->IO).MousePos;
  (pIVar53->IO).MousePosPrev = IVar62;
  fVar82 = IVar62.x;
  lVar52 = 0;
  do {
    if ((pIVar53->IO).MouseDown[lVar52] == true) {
      fVar71 = (pIVar53->IO).MouseDownDuration[lVar52];
      pbVar48 = (pIVar53->IO).MouseClicked + lVar52;
      *pbVar48 = fVar71 < 0.0;
      (pIVar53->IO).MouseClickedCount[lVar52] = 0;
      pbVar48[0x1e] = false;
      (pIVar53->IO).MouseDownDurationPrev[lVar52] = fVar71;
      if (0.0 <= fVar71) {
        (pIVar53->IO).MouseDownDuration[lVar52] = fVar71 + (pIVar53->IO).DeltaTime;
        fVar71 = 0.0;
        if (-256000.0 <= fVar82 && -256000.0 <= fVar59) {
          fVar71 = fVar82 - (pIVar53->IO).MouseClickedPos[lVar52].x;
          fVar83 = fVar59 - (pIVar53->IO).MouseClickedPos[lVar52].y;
          fVar71 = fVar71 * fVar71 + fVar83 * fVar83;
        }
        fVar83 = (pIVar53->IO).MouseDragMaxDistanceSqr[lVar52];
        uVar33 = -(uint)(fVar71 <= fVar83);
        (pIVar53->IO).MouseDragMaxDistanceSqr[lVar52] =
             (float)(~uVar33 & (uint)fVar71 | (uint)fVar83 & uVar33);
        goto LAB_00111f82;
      }
      (pIVar53->IO).MouseDownDuration[lVar52] = 0.0;
      dVar10 = pIVar53->Time;
      if ((pIVar53->IO).MouseDoubleClickTime <=
          (float)(dVar10 - (pIVar53->IO).MouseClickedTime[lVar52])) {
LAB_00111f87:
        (pIVar53->IO).MouseClickedLastCount[lVar52] = 1;
      }
      else {
        fVar71 = 0.0;
        fVar83 = 0.0;
        if (-256000.0 <= fVar82 && -256000.0 <= fVar59) {
          IVar60 = (pIVar53->IO).MouseClickedPos[lVar52];
          fVar71 = fVar82 - IVar60.x;
          fVar83 = fVar59 - IVar60.y;
        }
        fVar72 = (pIVar53->IO).MouseDoubleClickMaxDist;
        if (fVar72 * fVar72 <= fVar71 * fVar71 + fVar83 * fVar83) goto LAB_00111f87;
        pIVar7 = (pIVar53->IO).MouseClickedLastCount + lVar52;
        *pIVar7 = *pIVar7 + 1;
      }
      (pIVar53->IO).MouseClickedTime[lVar52] = dVar10;
      (pIVar53->IO).MouseClickedPos[lVar52] = IVar62;
      IVar12 = (pIVar53->IO).MouseClickedLastCount[lVar52];
      (pIVar53->IO).MouseClickedCount[lVar52] = IVar12;
      (pIVar53->IO).MouseDragMaxDistanceSqr[lVar52] = 0.0;
      bVar56 = IVar12 == 2;
    }
    else {
      (pIVar53->IO).MouseClicked[lVar52] = false;
      (pIVar53->IO).MouseClickedCount[lVar52] = 0;
      fVar71 = (pIVar53->IO).MouseDownDuration[lVar52];
      (pIVar53->IO).MouseReleased[lVar52] = 0.0 <= fVar71;
      pbVar48 = (pIVar53->IO).MouseClicked + lVar52;
      (pIVar53->IO).MouseDownDurationPrev[lVar52] = fVar71;
      (pIVar53->IO).MouseDownDuration[lVar52] = -1.0;
LAB_00111f82:
      bVar56 = false;
    }
    (pIVar53->IO).MouseDoubleClicked[lVar52] = bVar56;
    if (*pbVar48 == true) {
      pIVar53->NavDisableMouseHover = false;
    }
    lVar52 = lVar52 + 1;
  } while (lVar52 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar37 = GetTopMostPopupModal();
  if ((pIVar37 != (ImGuiWindow *)0x0) ||
     ((pIVar27->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar27->NavWindowingHighlightAlpha)))) {
    fVar59 = (pIVar27->IO).DeltaTime * 6.0 + pIVar27->DimBgRatio;
    if (1.0 <= fVar59) {
      fVar59 = 1.0;
    }
    pIVar27->DimBgRatio = fVar59;
  }
  else {
    fVar59 = (pIVar27->IO).DeltaTime * -10.0 + pIVar27->DimBgRatio;
    pIVar27->DimBgRatio = (float)(-(uint)(0.0 <= fVar59) & (uint)fVar59);
  }
  pIVar27->MouseCursor = 0;
  pIVar27->WantTextInputNextFrame = -1;
  pIVar27->WantCaptureMouseNextFrame = -1;
  pIVar27->WantCaptureKeyboardNextFrame = -1;
  uVar28 = *(undefined3 *)&(pIVar27->PlatformImeData).field_0x1;
  fVar59 = (pIVar27->PlatformImeData).InputPos.x;
  uVar26 = *(undefined8 *)&(pIVar27->PlatformImeData).InputPos.y;
  (pIVar27->PlatformImeDataPrev).WantVisible = (pIVar27->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar27->PlatformImeDataPrev).field_0x1 = uVar28;
  (pIVar27->PlatformImeDataPrev).InputPos.x = fVar59;
  *(undefined8 *)&(pIVar27->PlatformImeDataPrev).InputPos.y = uVar26;
  (pIVar27->PlatformImeData).WantVisible = false;
  pIVar55 = GImGui;
  pIVar37 = GImGui->WheelingWindow;
  if (pIVar37 == (ImGuiWindow *)0x0) {
LAB_001121c2:
    pIVar37 = (ImGuiWindow *)0x0;
  }
  else {
    fVar82 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar82;
    fVar59 = (pIVar55->IO).MousePos.x;
    if ((((-256000.0 <= fVar59) && (fVar71 = (pIVar55->IO).MousePos.y, -256000.0 <= fVar71)) &&
        (fVar59 = fVar59 - (pIVar55->WheelingWindowRefMousePos).x,
        fVar71 = fVar71 - (pIVar55->WheelingWindowRefMousePos).y,
        fVar83 = (pIVar55->IO).MouseDragThreshold,
        fVar83 * fVar83 < fVar59 * fVar59 + fVar71 * fVar71)) || (fVar82 <= 0.0)) {
      pIVar55->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar55->WheelingWindowTimer = 0.0;
      goto LAB_001121c2;
    }
  }
  fVar59 = (pIVar55->IO).MouseWheel;
  if ((((((fVar59 != 0.0) || (fVar82 = (pIVar55->IO).MouseWheelH, fVar82 != 0.0)) || (NAN(fVar82)))
       && ((pIVar55->ActiveId == 0 || (pIVar55->ActiveIdUsingMouseWheel == false)))) &&
      (((pIVar55->HoveredIdPreviousFrame == 0 ||
        (pIVar55->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
       ((pIVar43 = pIVar37, pIVar37 != (ImGuiWindow *)0x0 ||
        (pIVar43 = pIVar55->HoveredWindow, pIVar43 != (ImGuiWindow *)0x0)))))) &&
     (pIVar43->Collapsed == false)) {
    bVar56 = (pIVar55->IO).KeyCtrl;
    if ((fVar59 != 0.0) || (NAN(fVar59))) {
      if ((bVar56 & 1U) == 0) goto LAB_00112bb0;
      if ((pIVar55->IO).FontAllowUserScaling == true) {
        if (pIVar37 != pIVar43) {
          pIVar55->WheelingWindow = pIVar43;
          pIVar55->WheelingWindowRefMousePos = (pIVar55->IO).MousePos;
          pIVar55->WheelingWindowTimer = 2.0;
        }
        fVar82 = pIVar43->FontWindowScale;
        fVar71 = fVar59 * 0.1 + fVar82;
        fVar59 = 2.5;
        if (fVar71 <= 2.5) {
          fVar59 = fVar71;
        }
        fVar59 = (float)(-(uint)(fVar71 < 0.5) & 0x3f000000 | ~-(uint)(fVar71 < 0.5) & (uint)fVar59)
        ;
        pIVar43->FontWindowScale = fVar59;
        if (pIVar43 == pIVar43->RootWindow) {
          fVar59 = fVar59 / fVar82;
          IVar62 = pIVar43->Size;
          auVar78._8_8_ = 0;
          auVar78._0_4_ = IVar62.x;
          auVar78._4_4_ = IVar62.y;
          IVar60 = (pIVar55->IO).MousePos;
          fVar82 = (pIVar43->Pos).x;
          fVar71 = (pIVar43->Pos).y;
          auVar81._0_4_ = (IVar60.x - fVar82) * (1.0 - fVar59) * IVar62.x;
          auVar81._4_4_ = (IVar60.y - fVar71) * (1.0 - fVar59) * IVar62.y;
          auVar81._8_8_ = 0;
          auVar70 = divps(auVar81,auVar78);
          local_48.Min.x = auVar70._0_4_ + fVar82;
          local_48.Min.y = auVar70._4_4_ + fVar71;
          SetWindowPos(pIVar43,&local_48.Min,0);
          IVar62 = pIVar43->SizeFull;
          IVar64.x = (float)(int)((pIVar43->Size).x * fVar59);
          IVar64.y = (float)(int)((pIVar43->Size).y * fVar59);
          pIVar43->Size = IVar64;
          (pIVar43->SizeFull).x = (float)(int)(IVar62.x * fVar59);
          (pIVar43->SizeFull).y = (float)(int)(IVar62.y * fVar59);
        }
      }
    }
    else if ((bVar56 & 1U) == 0) {
LAB_00112bb0:
      if (((pIVar55->IO).KeyShift != true) ||
         (fVar82 = fVar59, (pIVar55->IO).ConfigMacOSXBehaviors == true)) {
        fVar82 = (pIVar55->IO).MouseWheelH;
        if ((fVar59 != 0.0) || (NAN(fVar59))) {
          if (pIVar37 != pIVar43) {
            pIVar55->WheelingWindow = pIVar43;
            pIVar55->WheelingWindowRefMousePos = (pIVar55->IO).MousePos;
            pIVar55->WheelingWindowTimer = 2.0;
            pIVar37 = pIVar43;
          }
          uVar33 = pIVar43->Flags;
          while (((uVar33 >> 0x18 & 1) != 0 &&
                 (((uVar33 & 0x210) == 0x10 ||
                  ((fVar71 = (pIVar43->ScrollMax).y, fVar71 == 0.0 && (!NAN(fVar71)))))))) {
            pIVar43 = pIVar43->ParentWindow;
            uVar33 = pIVar43->Flags;
          }
          if ((uVar33 & 0x210) == 0) {
            fVar71 = ((pIVar43->InnerRect).Max.y - (pIVar43->InnerRect).Min.y) * 0.67;
            fVar83 = pIVar55->FontBaseSize * pIVar43->FontWindowScale;
            if (pIVar43->ParentWindow != (ImGuiWindow *)0x0) {
              fVar83 = fVar83 * pIVar43->ParentWindow->FontWindowScale;
            }
            fVar72 = fVar83 * 5.0;
            if (fVar71 <= fVar83 * 5.0) {
              fVar72 = fVar71;
            }
            (pIVar43->ScrollTarget).y = (pIVar43->Scroll).y - fVar59 * (float)(int)fVar72;
            (pIVar43->ScrollTargetCenterRatio).y = 0.0;
            (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      if ((fVar82 != 0.0) || (NAN(fVar82))) {
        if (pIVar37 != pIVar43) {
          pIVar55->WheelingWindow = pIVar43;
          pIVar55->WheelingWindowRefMousePos = (pIVar55->IO).MousePos;
          pIVar55->WheelingWindowTimer = 2.0;
        }
        while ((uVar33 = pIVar43->Flags, (uVar33 >> 0x18 & 1) != 0 &&
               (((uVar33 & 0x210) == 0x10 ||
                ((fVar59 = (pIVar43->ScrollMax).x, fVar59 == 0.0 && (!NAN(fVar59)))))))) {
          pIVar43 = pIVar43->ParentWindow;
        }
        if ((uVar33 & 0x210) == 0) {
          fVar59 = ((pIVar43->InnerRect).Max.x - (pIVar43->InnerRect).Min.x) * 0.67;
          fVar71 = pIVar55->FontBaseSize * pIVar43->FontWindowScale;
          if (pIVar43->ParentWindow != (ImGuiWindow *)0x0) {
            fVar71 = fVar71 * pIVar43->ParentWindow->FontWindowScale;
          }
          fVar83 = fVar71 + fVar71;
          if (fVar59 <= fVar71 + fVar71) {
            fVar83 = fVar59;
          }
          (pIVar43->ScrollTarget).x = (pIVar43->Scroll).x - fVar82 * (float)(int)fVar83;
          (pIVar43->ScrollTargetCenterRatio).x = 0.0;
          (pIVar43->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  fVar59 = 3.4028235e+38;
  if ((pIVar27->GcCompactAll == false) &&
     (fVar82 = (pIVar27->IO).ConfigMemoryCompactTimer, 0.0 <= fVar82)) {
    fVar59 = (float)pIVar27->Time - fVar82;
  }
  uVar33 = (pIVar27->Windows).Size;
  if (uVar33 != 0) {
    uVar36 = 0;
    do {
      pIVar37 = (pIVar27->Windows).Data[uVar36];
      bVar56 = pIVar37->Active;
      pIVar37->WasActive = bVar56;
      pIVar37->BeginCount = 0;
      pIVar37->Active = false;
      pIVar37->WriteAccessed = false;
      if (((bVar56 == false) && (pIVar37->MemoryCompacted == false)) &&
         (pIVar37->LastTimeActive <= fVar59 && fVar59 != pIVar37->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar37);
        uVar33 = (pIVar27->Windows).Size;
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar33);
  }
  iVar45 = (pIVar27->TablesLastTimeActive).Size;
  if (0 < iVar45) {
    lVar52 = 0;
    lVar51 = 0;
    do {
      fVar82 = (pIVar27->TablesLastTimeActive).Data[lVar51];
      if ((0.0 <= fVar82) && (fVar82 < fVar59)) {
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar27->Tables).Buf.Data)->ID + lVar52));
        iVar45 = (pIVar27->TablesLastTimeActive).Size;
      }
      lVar51 = lVar51 + 1;
      lVar52 = lVar52 + 0x208;
    } while (lVar51 < iVar45);
  }
  iVar45 = (pIVar27->TablesTempData).Size;
  if (0 < iVar45) {
    lVar52 = 0;
    lVar51 = 0;
    do {
      pIVar20 = (pIVar27->TablesTempData).Data;
      fVar82 = *(float *)((long)&pIVar20->LastTimeActive + lVar52);
      if ((0.0 <= fVar82) && (fVar82 < fVar59)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar20->TableIndex + lVar52));
        iVar45 = (pIVar27->TablesTempData).Size;
      }
      lVar51 = lVar51 + 1;
      lVar52 = lVar52 + 0x70;
    } while (lVar51 < iVar45);
  }
  if (pIVar27->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar27->GcCompactAll = false;
  if ((pIVar27->NavWindow != (ImGuiWindow *)0x0) && (pIVar27->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar27->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_01 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar21 = (pIVar27->CurrentWindowStack).Data;
    if (pIVar21 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest_01,pIVar21,(long)(pIVar27->CurrentWindowStack).Size * 0x58);
      pIVar21 = (pIVar27->CurrentWindowStack).Data;
      if ((pIVar21 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
    }
    (pIVar27->CurrentWindowStack).Data = __dest_01;
    (pIVar27->CurrentWindowStack).Capacity = 0;
  }
  (pIVar27->CurrentWindowStack).Size = 0;
  if ((pIVar27->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_02 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar22 = (pIVar27->BeginPopupStack).Data;
    if (pIVar22 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_02,pIVar22,(long)(pIVar27->BeginPopupStack).Size * 0x30);
      pIVar22 = (pIVar27->BeginPopupStack).Data;
      if ((pIVar22 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
    }
    (pIVar27->BeginPopupStack).Data = __dest_02;
    (pIVar27->BeginPopupStack).Capacity = 0;
  }
  (pIVar27->BeginPopupStack).Size = 0;
  iVar45 = (pIVar27->ItemFlagsStack).Capacity;
  if (iVar45 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    piVar39 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar40 = (pIVar27->ItemFlagsStack).Data;
    if (piVar40 != (int *)0x0) {
      memcpy(piVar39,piVar40,(long)(pIVar27->ItemFlagsStack).Size << 2);
      piVar40 = (pIVar27->ItemFlagsStack).Data;
      if ((piVar40 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar40,GImAllocatorUserData);
    }
    (pIVar27->ItemFlagsStack).Data = piVar39;
    (pIVar27->ItemFlagsStack).Size = 0;
    (pIVar27->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar27->ItemFlagsStack).Size = 0;
    if (iVar45 != 0) {
      piVar40 = (pIVar27->ItemFlagsStack).Data;
      lVar52 = 0;
      goto LAB_0011260d;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar40 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar40 = *piVar40 + 1;
  }
  piVar40 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar39 = (pIVar27->ItemFlagsStack).Data;
  if (piVar39 != (int *)0x0) {
    memcpy(piVar40,piVar39,(long)(pIVar27->ItemFlagsStack).Size << 2);
    piVar39 = (pIVar27->ItemFlagsStack).Data;
    if ((piVar39 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar39,GImAllocatorUserData);
  }
  (pIVar27->ItemFlagsStack).Data = piVar40;
  (pIVar27->ItemFlagsStack).Capacity = 8;
  lVar52 = (long)(pIVar27->ItemFlagsStack).Size;
LAB_0011260d:
  piVar40[lVar52] = 0;
  (pIVar27->ItemFlagsStack).Size = (pIVar27->ItemFlagsStack).Size + 1;
  if ((pIVar27->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_03 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar23 = (pIVar27->GroupStack).Data;
    if (pIVar23 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_03,pIVar23,(long)(pIVar27->GroupStack).Size * 0x30);
      pIVar23 = (pIVar27->GroupStack).Data;
      if ((pIVar23 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
    }
    (pIVar27->GroupStack).Data = __dest_03;
    (pIVar27->GroupStack).Capacity = 0;
  }
  (pIVar27->GroupStack).Size = 0;
  pIVar55 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar55->DebugItemPickerActive == true) {
    uVar33 = pIVar55->HoveredIdPreviousFrame;
    pIVar55->MouseCursor = 7;
    bVar56 = IsKeyPressed(0x20e,true);
    if (bVar56) {
      pIVar55->DebugItemPickerActive = false;
    }
    if (uVar33 != 0 && (pIVar55->IO).MouseDownDuration[0] == 0.0) {
      pIVar55->DebugItemPickerBreakId = uVar33;
      pIVar55->DebugItemPickerActive = false;
    }
    *(byte *)&(pIVar55->NextWindowData).Flags = (byte)(pIVar55->NextWindowData).Flags | 0x40;
    (pIVar55->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar33);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar33 == 0),"Click to break in debugger!");
    End();
    pIVar55 = GImGui;
  }
  pIVar55->DebugHookIdInfo = 0;
  if (pIVar55->FrameCount == (pIVar55->DebugStackTool).LastActiveFrame + 1) {
    IVar41 = pIVar55->HoveredIdPreviousFrame;
    if (IVar41 == 0) {
      IVar41 = pIVar55->ActiveId;
    }
    if ((pIVar55->DebugStackTool).QueryId != IVar41) {
      (pIVar55->DebugStackTool).QueryId = IVar41;
      (pIVar55->DebugStackTool).StackLevel = -1;
      if ((pIVar55->DebugStackTool).Results.Capacity < 0) {
        piVar40 = &(pIVar55->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + 1;
        __dest_04 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar24 = (pIVar55->DebugStackTool).Results.Data;
        if (pIVar24 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_04,pIVar24,(long)(pIVar55->DebugStackTool).Results.Size << 6);
          pIVar24 = (pIVar55->DebugStackTool).Results.Data;
          if ((pIVar24 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar40 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar40 = *piVar40 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar24,GImAllocatorUserData);
        }
        (pIVar55->DebugStackTool).Results.Data = __dest_04;
        (pIVar55->DebugStackTool).Results.Capacity = 0;
      }
      (pIVar55->DebugStackTool).Results.Size = 0;
    }
    if (IVar41 != 0) {
      uVar33 = (pIVar55->DebugStackTool).StackLevel;
      lVar52 = (long)(int)uVar33;
      if (lVar52 < 0) {
        if (uVar33 == 0xffffffff) {
          pIVar55->DebugHookIdInfo = IVar41;
        }
      }
      else {
        iVar45 = (pIVar55->DebugStackTool).Results.Size;
        if (((int)uVar33 < iVar45) &&
           ((pIVar24 = (pIVar55->DebugStackTool).Results.Data, pIVar24[lVar52].QuerySuccess != false
            || ('\x02' < pIVar24[lVar52].QueryFrameCount)))) {
          uVar33 = uVar33 + 1;
          (pIVar55->DebugStackTool).StackLevel = uVar33;
        }
        if ((int)uVar33 < iVar45) {
          pIVar24 = (pIVar55->DebugStackTool).Results.Data;
          pIVar55->DebugHookIdInfo = pIVar24[uVar33].ID;
          pIVar6 = &pIVar24[uVar33].QueryFrameCount;
          *pIVar6 = *pIVar6 + '\x01';
        }
      }
    }
  }
  pIVar27->WithinFrameScopeWithImplicitWindow = true;
  pIVar55 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar55->NextWindowData).SizeVal.x = 400.0;
  (pIVar55->NextWindowData).SizeVal.y = 400.0;
  (pIVar55->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  iVar45 = (pIVar27->Hooks).Size;
  if (0 < iVar45) {
    lVar52 = 0;
    lVar51 = 0;
    do {
      pIVar15 = (pIVar27->Hooks).Data;
      if (*(int *)(pIVar15 + lVar52 + 4) == 1) {
        (**(code **)(pIVar15 + lVar52 + 0x10))(pIVar27,pIVar15 + lVar52);
        iVar45 = (pIVar27->Hooks).Size;
      }
      lVar51 = lVar51 + 1;
      lVar52 = lVar52 + 0x20;
    } while (lVar51 < iVar45);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}